

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O2

void TIFFSwabArrayOfTriples(uint8_t *tp,tmsize_t n)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  
  puVar2 = tp + 2;
  for (; 0 < n; n = n + -1) {
    uVar1 = *puVar2;
    *puVar2 = puVar2[-2];
    puVar2[-2] = uVar1;
    puVar2 = puVar2 + 3;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfTriples(register uint8_t *tp, tmsize_t n)
{
    unsigned char *cp;
    unsigned char t;

    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)tp;
        t = cp[2];
        cp[2] = cp[0];
        cp[0] = t;
        tp += 3;
    }
}